

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

Node * __thiscall asmjit::ConstPool::Tree::get(Tree *this,void *data)

{
  size_t __n;
  uint uVar1;
  Node *pNVar2;
  
  pNVar2 = this->_root;
  if (pNVar2 != (Node *)0x0) {
    __n = this->_dataSize;
    do {
      uVar1 = memcmp(pNVar2 + 1,data,__n);
      if (uVar1 == 0) {
        return pNVar2;
      }
      pNVar2 = pNVar2->_link[uVar1 >> 0x1f];
    } while (pNVar2 != (Node *)0x0);
  }
  return (Node *)0x0;
}

Assistant:

ConstPool::Node* ConstPool::Tree::get(const void* data) noexcept {
  ConstPool::Node* node = _root;
  size_t dataSize = _dataSize;

  while (node) {
    int c = ::memcmp(node->getData(), data, dataSize);
    if (c == 0)
      return node;
    node = node->_link[c < 0];
  }

  return nullptr;
}